

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus initCollector(genxWriter w,collector *c)

{
  FILE *pFVar1;
  genxWriter in_RSI;
  genxStatus local_4;
  
  *(undefined4 *)((long)&in_RSI->sender + 4) = 100;
  pFVar1 = (FILE *)allocate(in_RSI,0);
  in_RSI->file = pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    local_4 = GENX_ALLOC_FAILED;
  }
  else {
    *(undefined4 *)&in_RSI->sender = 0;
    local_4 = GENX_SUCCESS;
  }
  return local_4;
}

Assistant:

static genxStatus initCollector(genxWriter w, collector * c)
{
  c->space = 100;
  if ((c->buf = (utf8) allocate(w, c->space)) == NULL)
    return GENX_ALLOC_FAILED;
  c->used = 0;
  return GENX_SUCCESS;
}